

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

void get_4_nz_map_contexts_ver(uint8_t *levels,int width,ptrdiff_t *offsets,int8_t *coeff_contexts)

{
  undefined8 *in_RCX;
  int in_ESI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  int col;
  __m128i level [5];
  __m128i count;
  __m128i pos_to_offset;
  int stride;
  __m128i *in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeb0;
  undefined1 uVar1;
  undefined1 uVar2;
  int in_stack_fffffffffffffebc;
  uint8_t *in_stack_fffffffffffffec0;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_c8;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  
  uVar1 = 0x24;
  uVar2 = 0x1a;
  local_c8 = in_RCX;
  do {
    load_levels_4x4x5_sse2
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
               (ptrdiff_t *)
               CONCAT44(in_ESI,CONCAT13(uVar2,CONCAT12(uVar1,in_stack_fffffffffffffeb0))),
               in_stack_fffffffffffffea8);
    get_coeff_contexts_kernel_sse2((__m128i *)&stack0xfffffffffffffeb8);
    local_88 = (char)extraout_XMM0_Qa;
    cStack_87 = (char)((ulong)extraout_XMM0_Qa >> 8);
    cStack_86 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
    cStack_85 = (char)((ulong)extraout_XMM0_Qa >> 0x18);
    cStack_84 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
    cStack_83 = (char)((ulong)extraout_XMM0_Qa >> 0x28);
    cStack_82 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
    cStack_81 = (char)((ulong)extraout_XMM0_Qa >> 0x38);
    cStack_80 = (char)extraout_XMM0_Qb;
    cStack_7f = (char)((ulong)extraout_XMM0_Qb >> 8);
    cStack_7e = (char)((ulong)extraout_XMM0_Qb >> 0x10);
    cStack_7d = (char)((ulong)extraout_XMM0_Qb >> 0x18);
    cStack_7c = (char)((ulong)extraout_XMM0_Qb >> 0x20);
    cStack_7b = (char)((ulong)extraout_XMM0_Qb >> 0x28);
    cStack_7a = (char)((ulong)extraout_XMM0_Qb >> 0x30);
    cStack_79 = (char)((ulong)extraout_XMM0_Qb >> 0x38);
    local_f8 = CONCAT17(cStack_81 + '$',
                        CONCAT16(cStack_82 + '$',
                                 CONCAT15(cStack_83 + '\x1f',
                                          CONCAT14(cStack_84 + '\x1a',
                                                   CONCAT13(cStack_85 + '$',
                                                            CONCAT12(cStack_86 + '$',
                                                                     CONCAT11(cStack_87 + '\x1f',
                                                                              local_88 + '\x1a')))))
                                ));
    uStack_f0 = CONCAT17(cStack_79 + '$',
                         CONCAT16(cStack_7a + '$',
                                  CONCAT15(cStack_7b + '\x1f',
                                           CONCAT14(cStack_7c + '\x1a',
                                                    CONCAT13(cStack_7d + '$',
                                                             CONCAT12(cStack_7e + '$',
                                                                      CONCAT11(cStack_7f + '\x1f',
                                                                               cStack_80 + '\x1a')))
                                                   ))));
    *local_c8 = local_f8;
    local_c8[1] = uStack_f0;
    local_c8 = local_c8 + 2;
    in_ESI = in_ESI + -4;
  } while (in_ESI != 0);
  return;
}

Assistant:

static inline void get_4_nz_map_contexts_ver(const uint8_t *levels,
                                             const int width,
                                             const ptrdiff_t *const offsets,
                                             int8_t *coeff_contexts) {
  const int stride = 4 + TX_PAD_HOR;
  const __m128i pos_to_offset =
      _mm_setr_epi8(SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10);
  __m128i count;
  __m128i level[5];
  int col = width;

  assert(!(width % 4));

  do {
    load_levels_4x4x5_sse2(levels, stride, offsets, level);
    count = get_coeff_contexts_kernel_sse2(level);
    count = _mm_add_epi8(count, pos_to_offset);
    _mm_store_si128((__m128i *)coeff_contexts, count);
    levels += 4 * stride;
    coeff_contexts += 16;
    col -= 4;
  } while (col);
}